

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsettingsd.cc
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  pointer puVar6;
  undefined8 uVar7;
  undefined1 local_1a8 [8];
  SettingsManager manager;
  size_t i;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  char *endptr;
  undefined1 local_c8 [4];
  int ch;
  option options [4];
  undefined1 local_40 [8];
  string config_file;
  int screen;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  config_file.field_2._12_4_ = 0xffffffff;
  std::__cxx11::string::string((string *)local_40);
  memcpy(local_c8,&DAT_00114b20,0x80);
  _opterr = 0;
  while (iVar3 = getopt_long(argc,argv,"c:hs:",local_c8,0), iVar3 != -1) {
    if (iVar3 == 99) {
      std::__cxx11::string::operator=((string *)local_40,_optarg);
    }
    else {
      if ((iVar3 == 0x68) || (iVar3 == 0x3f)) {
        fprintf(_stderr,"%s",main::kUsage);
        argv_local._4_4_ = 1;
        goto LAB_00103a9a;
      }
      if (iVar3 == 0x73) {
        paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar4 = strtol(_optarg,(char **)&paths.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,10);
        config_file.field_2._12_4_ = (undefined4)lVar4;
        if (((*_optarg == '\0') ||
            ((paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus != (_Alloc_hider)0x0)
            ) || ((int)config_file.field_2._12_4_ < 0)) goto LAB_00103801;
      }
    }
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) goto LAB_001039b8;
  xsettingsd::GetDefaultConfigFilePaths_abi_cxx11_();
  anon_unknown.dwarf_9fd::GetFirstReadablePath
            ((string *)&i,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_100);
  std::__cxx11::string::operator=((string *)local_40,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar2 = false;
  }
  else {
    fprintf(_stderr,"%s: Couldn\'t find config file. Tried the following:\n",xsettingsd::kProgName);
    for (manager.windows_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        puVar1 = manager.windows_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
        puVar6 = (pointer)std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_100), __stream = _stderr, puVar1 < puVar6;
        manager.windows_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)manager.windows_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_100,
                   (size_type)
                   manager.windows_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      uVar7 = std::__cxx11::string::c_str();
      fprintf(__stream,"  %s\n",uVar7);
    }
    argv_local._4_4_ = 1;
    bVar2 = true;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  if (!bVar2) {
LAB_001039b8:
    xsettingsd::SettingsManager::SettingsManager((SettingsManager *)local_1a8,(string *)local_40);
    bVar2 = xsettingsd::SettingsManager::LoadConfig((SettingsManager *)local_1a8);
    if (bVar2) {
      bVar2 = xsettingsd::SettingsManager::InitX11
                        ((SettingsManager *)local_1a8,config_file.field_2._12_4_,true);
      if (bVar2) {
        signal(1,anon_unknown.dwarf_9fd::HandleSignal);
        xsettingsd::SettingsManager::RunEventLoop((SettingsManager *)local_1a8);
        argv_local._4_4_ = 0;
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
    xsettingsd::SettingsManager::~SettingsManager((SettingsManager *)local_1a8);
  }
LAB_00103a9a:
  std::__cxx11::string::~string((string *)local_40);
  return argv_local._4_4_;
LAB_00103801:
  fprintf(_stderr,"Invalid screen \"%s\"\n",_optarg);
  argv_local._4_4_ = 1;
  goto LAB_00103a9a;
}

Assistant:

int main(int argc, char** argv) {
  static const char* kUsage =
      "Usage: xsettingsd [OPTION] ...\n"
      "\n"
      "Daemon implementing the XSETTINGS spec to control settings for X11\n"
      "applications.\n"
      "\n"
      "Options: -c, --config=FILE    config file (default is ~/.xsettingsd)\n"
      "         -h, --help           print this help message\n"
      "         -s, --screen=SCREEN  screen to use (default is all)\n";

  int screen = -1;
  string config_file;

  struct option options[] = {
    { "config", 1, NULL, 'c', },
    { "help", 0, NULL, 'h', },
    { "screen", 1, NULL, 's', },
    { NULL, 0, NULL, 0 },
  };

  opterr = 0;
  while (true) {
    int ch = getopt_long(argc, argv, "c:hs:", options, NULL);
    if (ch == -1) {
      break;
    } else if (ch == 'c') {
      config_file = optarg;
    } else if (ch == 'h' || ch == '?') {
      fprintf(stderr, "%s", kUsage);
      return 1;
    } else if (ch == 's') {
      char* endptr = NULL;
      screen = strtol(optarg, &endptr, 10);
      if (optarg[0] == '\0' || endptr[0] != '\0' || screen < 0) {
        fprintf(stderr, "Invalid screen \"%s\"\n", optarg);
        return 1;
      }
    }
  }

  // Check default config file locations if one wasn't supplied via a flag.
  if (config_file.empty()) {
    const vector<string> paths = xsettingsd::GetDefaultConfigFilePaths();
    config_file = GetFirstReadablePath(paths);
    if (config_file.empty()) {
      fprintf(stderr, "%s: Couldn't find config file. Tried the following:\n",
              xsettingsd::kProgName);
      for (size_t i = 0; i < paths.size(); ++i)
        fprintf(stderr, "  %s\n", paths[i].c_str());
      return 1;
    }
  }

  xsettingsd::SettingsManager manager(config_file);
  if (!manager.LoadConfig())
    return 1;
  if (!manager.InitX11(screen, true))
    return 1;

  signal(SIGHUP, HandleSignal);

  manager.RunEventLoop();
  return 0;
}